

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

string * __thiscall
google::protobuf::MessageLite::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,MessageLite *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  undefined8 in_RCX;
  void *unaff_R15;
  Hex hex;
  long *local_98;
  undefined8 uStack_90;
  long local_88 [2];
  AlphaNum local_78;
  undefined8 local_48;
  long *local_40;
  long lVar2;
  
  iVar1 = (*this->_vptr_MessageLite[4])(this);
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 != 0) {
    if (*(char *)(lVar2 + 0x3c) == '\0') {
      (**(code **)(*(long *)(lVar2 + 0x40) + 0x20))(__return_storage_ptr__,this);
    }
    else {
      local_78.piece_._M_len = 0x11;
      local_78.piece_._M_str = "MessageLite at 0x";
      local_88[1] = 0;
      uStack_90 = 0;
      local_88[0] = 0;
      hex.width = (char)in_RCX;
      hex.fill = (char)((ulong)in_RCX >> 8);
      hex._10_6_ = (int6)((ulong)in_RCX >> 0x10);
      hex.value = 0x3001;
      local_98 = local_88;
      absl::lts_20240722::AbslStringify<absl::lts_20240722::strings_internal::StringifySink>
                ((lts_20240722 *)&local_98,(StringifySink *)this,hex);
      local_48 = uStack_90;
      local_40 = local_98;
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_78);
      if (local_98 != local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
    }
    return __return_storage_ptr__;
  }
  DebugString_abi_cxx11_();
  if (local_98 != (long *)unaff_R15) {
    operator_delete(local_98,local_88[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::string MessageLite::DebugString() const {
  auto* data = GetClassData();
  ABSL_DCHECK(data != nullptr);
  if (!data->is_lite) {
    return data->full().descriptor_methods->debug_string(*this);
  }

  return absl::StrCat("MessageLite at 0x", absl::Hex(this));
}